

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

void * tdefl_write_image_to_png_file_in_memory_ex
                 (void *pImage,int w,int h,int num_chans,size_t *pLen_out,mz_uint level,mz_bool flip
                 )

{
  int6 iVar1;
  size_t *psVar2;
  int iVar3;
  int iVar4;
  tdefl_status tVar5;
  mz_bool mVar6;
  tdefl_compressor *d;
  ulong uVar7;
  size_t sVar8;
  mz_ulong mVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  tdefl_output_buffer out_buf;
  int local_ac;
  size_t local_a8;
  byte bStack_a0;
  byte bStack_9f;
  byte bStack_9e;
  byte bStack_9d;
  byte abStack_9c [13];
  uint uStack_8f;
  byte bStack_8b;
  undefined2 uStack_8a;
  undefined1 uStack_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined4 uStack_83;
  ulong local_78;
  int local_70;
  int local_6c;
  long local_68;
  ulong uStack_60;
  tdefl_compressor *local_58;
  undefined8 uStack_50;
  size_t *local_40;
  void *local_38;
  
  local_38 = pImage;
  d = (tdefl_compressor *)malloc(0x4df78);
  *pLen_out = 0;
  if (d != (tdefl_compressor *)0x0) {
    iVar11 = num_chans * w;
    local_58 = (tdefl_compressor *)0x0;
    local_68 = 0;
    uStack_50 = 1;
    iVar3 = (iVar11 + 1) * h;
    iVar13 = 0x40;
    if (0x40 < iVar3) {
      iVar13 = iVar3;
    }
    uStack_60 = (ulong)(iVar13 + 0x39);
    local_78 = (ulong)(uint)h;
    local_6c = w;
    local_58 = (tdefl_compressor *)malloc(uStack_60);
    if (local_58 != (tdefl_compressor *)0x0) {
      local_ac = 0x29;
      iVar13 = 0x28;
      local_70 = num_chans;
      local_40 = pLen_out;
      do {
        iVar3 = iVar13;
        tdefl_output_buffer_putter(&local_ac,1,&local_68);
        iVar13 = iVar3 + -1;
        local_ac = iVar3;
      } while (iVar3 != 0);
      uVar7 = 10;
      if (level < 10) {
        uVar7 = (ulong)level;
      }
      tdefl_init(d,tdefl_output_buffer_putter,&local_68,
                 tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar7] | 0x1000)
      ;
      if (0 < (int)local_78) {
        iVar3 = 0;
        iVar13 = (int)local_78;
        do {
          iVar13 = iVar13 + -1;
          local_a8 = 1;
          tdefl_compress(d,&local_ac,&local_a8,(void *)0x0,(size_t *)0x0,TDEFL_NO_FLUSH);
          iVar4 = iVar13;
          if (flip == 0) {
            iVar4 = iVar3;
          }
          local_a8 = (long)iVar11;
          tdefl_compress(d,(void *)((long)(iVar4 * iVar11) + (long)local_38),&local_a8,(void *)0x0,
                         (size_t *)0x0,TDEFL_NO_FLUSH);
          iVar3 = iVar3 + 1;
        } while (iVar13 != 0);
      }
      local_a8 = 0;
      tVar5 = tdefl_compress(d,(void *)0x0,&local_a8,(void *)0x0,(size_t *)0x0,TDEFL_FINISH);
      psVar2 = local_40;
      if (tVar5 == TDEFL_STATUS_DONE) {
        sVar8 = local_68 - 0x29;
        *local_40 = sVar8;
        local_a8 = 0xa1a0a0d474e5089;
        bStack_a0 = 0;
        bStack_9f = 0;
        bStack_9e = 0;
        bStack_9d = 0xd;
        abStack_9c[0] = 0x49;
        abStack_9c[1] = 0x48;
        abStack_9c[2] = 0x44;
        abStack_9c[3] = 0x52;
        abStack_9c[4] = 0;
        abStack_9c[5] = 0;
        abStack_9c[6] = (byte)((uint)local_6c >> 8);
        abStack_9c[7] = (char)local_6c;
        abStack_9c[8] = 0;
        abStack_9c[9] = 0;
        abStack_9c[10] = (byte)(local_78 >> 8);
        abStack_9c[0xb] = (char)local_78;
        abStack_9c[0xc] = 8;
        uStack_8f = (uint)""[local_70];
        bStack_8b = 0;
        uStack_8a = 0;
        uStack_88 = 0;
        uStack_87 = (undefined1)(sVar8 >> 0x18);
        uStack_86 = (undefined1)(sVar8 >> 0x10);
        uStack_85 = (undefined1)(sVar8 >> 8);
        uStack_84 = (undefined1)sVar8;
        uStack_83 = 0x54414449;
        uVar12 = 0xffffffff;
        lVar10 = -0x11;
        do {
          uVar12 = uVar12 >> 4 ^ mz_crc32::s_crc32[(uVar12 ^ (&bStack_8b)[lVar10]) & 0xf];
          uVar12 = uVar12 >> 4 ^ mz_crc32::s_crc32[(uint)((&bStack_8b)[lVar10] >> 4) ^ uVar12 & 0xf]
          ;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0);
        uVar12 = ~uVar12;
        lVar10 = 0x1d;
        do {
          *(char *)((long)&local_a8 + lVar10) = (char)(uVar12 >> 0x18);
          uVar12 = uVar12 << 8;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x21);
        *(ulong *)((long)local_58->m_max_probes + 5) =
             CONCAT17(uStack_88,CONCAT25(uStack_8a,CONCAT14(bStack_8b,uStack_8f)));
        *(ulong *)((long)&local_58->m_adler32 + 1) =
             CONCAT44(0x54414449,
                      CONCAT13(uStack_84,CONCAT12(uStack_85,CONCAT11(uStack_86,uStack_87))));
        iVar1 = (uint6)CONCAT11((char)local_6c,abStack_9c[6]) << 0x10;
        local_58->m_flags = (int)iVar1;
        local_58->m_max_probes[0] =
             (int)(CONCAT17((char)local_78,CONCAT16(abStack_9c[10],iVar1)) >> 0x20);
        *(ulong *)(local_58->m_max_probes + 1) =
             CONCAT26(uStack_8a,CONCAT15(bStack_8b,CONCAT41(uStack_8f,8)));
        local_58->m_pPut_buf_func = (tdefl_put_buf_func_ptr)0xa1a0a0d474e5089;
        local_58->m_pPut_buf_user = (void *)0x524448490d000000;
        mVar6 = tdefl_output_buffer_putter("",0x10,&local_68);
        if (mVar6 != 0) {
          lVar10 = 0;
          mVar9 = mz_crc32(0,(mz_uint8 *)((long)&local_58->m_lookahead_pos + 1),*psVar2 + 4);
          do {
            *(char *)((long)local_58->m_max_probes + lVar10 + local_68 + -0x24) =
                 (char)(mVar9 >> 0x18);
            lVar10 = lVar10 + 1;
            mVar9 = (mz_ulong)(uint)((int)mVar9 << 8);
          } while (lVar10 != 4);
          *psVar2 = *psVar2 + 0x39;
          free(d);
          return local_58;
        }
        *psVar2 = 0;
      }
      free(d);
      d = local_58;
    }
    free(d);
  }
  return (void *)0x0;
}

Assistant:

void *tdefl_write_image_to_png_file_in_memory_ex(const void *pImage, int w, int h, int num_chans, size_t *pLen_out, mz_uint level, mz_bool flip)
{
  // Using a local copy of this array here in case MINIZ_NO_ZLIB_APIS was defined.
  static const mz_uint s_tdefl_png_num_probes[11] = { 0, 1, 6, 32,  16, 32, 128, 256,  512, 768, 1500 };
  tdefl_compressor *pComp = (tdefl_compressor *)MZ_MALLOC(sizeof(tdefl_compressor)); tdefl_output_buffer out_buf; int i, bpl = w * num_chans, y, z; mz_uint32 c; *pLen_out = 0;
  if (!pComp) return NULL;
  MZ_CLEAR_OBJ(out_buf); out_buf.m_expandable = MZ_TRUE; out_buf.m_capacity = 57+MZ_MAX(64, (1+bpl)*h); if (NULL == (out_buf.m_pBuf = (mz_uint8*)MZ_MALLOC(out_buf.m_capacity))) { MZ_FREE(pComp); return NULL; }
  // write dummy header
  for (z = 41; z; --z) tdefl_output_buffer_putter(&z, 1, &out_buf);
  // compress image data
  tdefl_init(pComp, tdefl_output_buffer_putter, &out_buf, s_tdefl_png_num_probes[MZ_MIN(10, level)] | TDEFL_WRITE_ZLIB_HEADER);
  for (y = 0; y < h; ++y) { tdefl_compress_buffer(pComp, &z, 1, TDEFL_NO_FLUSH); tdefl_compress_buffer(pComp, (mz_uint8*)pImage + (flip ? (h - 1 - y) : y) * bpl, bpl, TDEFL_NO_FLUSH); }
  if (tdefl_compress_buffer(pComp, NULL, 0, TDEFL_FINISH) != TDEFL_STATUS_DONE) { MZ_FREE(pComp); MZ_FREE(out_buf.m_pBuf); return NULL; }
  // write real header
  *pLen_out = out_buf.m_size-41;
  {
    static const mz_uint8 chans[] = {0x00, 0x00, 0x04, 0x02, 0x06};
    mz_uint8 pnghdr[41]={0x89,0x50,0x4e,0x47,0x0d,0x0a,0x1a,0x0a,0x00,0x00,0x00,0x0d,0x49,0x48,0x44,0x52,
      0,0,(mz_uint8)(w>>8),(mz_uint8)w,0,0,(mz_uint8)(h>>8),(mz_uint8)h,8,chans[num_chans],0,0,0,0,0,0,0,
      (mz_uint8)(*pLen_out>>24),(mz_uint8)(*pLen_out>>16),(mz_uint8)(*pLen_out>>8),(mz_uint8)*pLen_out,0x49,0x44,0x41,0x54};
    c=(mz_uint32)mz_crc32(MZ_CRC32_INIT,pnghdr+12,17); for (i=0; i<4; ++i, c<<=8) ((mz_uint8*)(pnghdr+29))[i]=(mz_uint8)(c>>24);
    memcpy(out_buf.m_pBuf, pnghdr, 41);
  }
  // write footer (IDAT CRC-32, followed by IEND chunk)
  if (!tdefl_output_buffer_putter("\0\0\0\0\0\0\0\0\x49\x45\x4e\x44\xae\x42\x60\x82", 16, &out_buf)) { *pLen_out = 0; MZ_FREE(pComp); MZ_FREE(out_buf.m_pBuf); return NULL; }
  c = (mz_uint32)mz_crc32(MZ_CRC32_INIT,out_buf.m_pBuf+41-4, *pLen_out+4); for (i=0; i<4; ++i, c<<=8) (out_buf.m_pBuf+out_buf.m_size-16)[i] = (mz_uint8)(c >> 24);
  // compute final size of file, grab compressed data buffer and return
  *pLen_out += 57; MZ_FREE(pComp); return out_buf.m_pBuf;
}